

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Expr * sqlite3ExprFunction(Parse *pParse,ExprList *pList,Token *pToken,int eDistinct)

{
  int in_ECX;
  Token *in_RDX;
  int *in_RSI;
  sqlite3 *in_RDI;
  sqlite3 *db;
  Expr *pNew;
  sqlite3_vfs *p;
  Parse *local_8;
  
  p = in_RDI->pVfs;
  local_8 = (Parse *)sqlite3ExprAlloc(in_RDI,(int)((ulong)in_RSI >> 0x20),in_RDX,in_ECX);
  if (local_8 == (Parse *)0x0) {
    sqlite3ExprListDelete((sqlite3 *)0x0,(ExprList *)p);
    local_8 = (Parse *)0x0;
  }
  else {
    ((anon_union_4_2_009eaf8f_for_w *)&local_8->nErr)->iJoin = (int)in_RDX->z - (int)in_RDI->pParse;
    if (((in_RSI != (int *)0x0) && (*(int *)&in_RDI->pVfs->xNextSystemCall < *in_RSI)) &&
       (*(char *)((long)&in_RDI->mutex + 6) == '\0')) {
      sqlite3ErrorMsg((Parse *)in_RDI,"too many arguments on function %T",in_RDX);
    }
    *(int **)&local_8->isMultiWrite = in_RSI;
    *(uint *)((long)&local_8->db + 4) = *(uint *)((long)&local_8->db + 4) | 8;
    sqlite3ExprSetHeightAndFlags(local_8,(Expr *)p);
    if (in_ECX == 1) {
      *(u32 *)((long)&local_8->db + 4) = *(u32 *)((long)&local_8->db + 4) | 4;
    }
  }
  return (Expr *)local_8;
}

Assistant:

SQLITE_PRIVATE Expr *sqlite3ExprFunction(
  Parse *pParse,        /* Parsing context */
  ExprList *pList,      /* Argument list */
  const Token *pToken,  /* Name of the function */
  int eDistinct         /* SF_Distinct or SF_ALL or 0 */
){
  Expr *pNew;
  sqlite3 *db = pParse->db;
  assert( pToken );
  pNew = sqlite3ExprAlloc(db, TK_FUNCTION, pToken, 1);
  if( pNew==0 ){
    sqlite3ExprListDelete(db, pList); /* Avoid memory leak when malloc fails */
    return 0;
  }
  assert( !ExprHasProperty(pNew, EP_InnerON|EP_OuterON) );
  pNew->w.iOfst = (int)(pToken->z - pParse->zTail);
  if( pList
   && pList->nExpr > pParse->db->aLimit[SQLITE_LIMIT_FUNCTION_ARG]
   && !pParse->nested
  ){
    sqlite3ErrorMsg(pParse, "too many arguments on function %T", pToken);
  }
  pNew->x.pList = pList;
  ExprSetProperty(pNew, EP_HasFunc);
  assert( ExprUseXList(pNew) );
  sqlite3ExprSetHeightAndFlags(pParse, pNew);
  if( eDistinct==SF_Distinct ) ExprSetProperty(pNew, EP_Distinct);
  return pNew;
}